

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O2

bool __thiscall bssl::der::ParseBmpString(der *this,Input in,string *out)

{
  int iVar1;
  uint8_t *__first;
  uint8_t *puVar2;
  size_t sVar3;
  bool bVar4;
  uchar *initial_capacity;
  uint32_t c;
  CBS cbs;
  ScopedCBB cbb;
  uint32_t local_74;
  CBS local_70;
  CBB local_60;
  
  initial_capacity = in.data_.data_;
  if (((undefined1  [16])in.data_ & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_70.data = (uint8_t *)this;
    local_70.len = (size_t)initial_capacity;
    CBB_zero(&local_60);
    iVar1 = CBB_init(&local_60,(size_t)initial_capacity);
    if (iVar1 != 0) {
      do {
        if (initial_capacity == (uchar *)0x0) {
          __first = CBB_data(&local_60);
          puVar2 = CBB_data(&local_60);
          sVar3 = CBB_len(&local_60);
          bVar4 = true;
          ::std::__cxx11::string::assign<unsigned_char_const*,void>
                    ((string *)in.data_.size_,__first,puVar2 + sVar3);
          goto LAB_0037fe87;
        }
        iVar1 = CBS_get_ucs2_be(&local_70,&local_74);
      } while ((iVar1 != 0) &&
              (iVar1 = CBB_add_utf8(&local_60,local_74), initial_capacity = (uchar *)local_70.len,
              iVar1 != 0));
    }
    bVar4 = false;
LAB_0037fe87:
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&local_60);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ParseBmpString(Input in, std::string *out) {
  if (in.size() % 2 != 0) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, in.data(), in.size());
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), in.size())) {
    return false;
  }

  while (CBS_len(&cbs) != 0) {
    uint32_t c;
    if (!CBS_get_ucs2_be(&cbs, &c) ||  //
        !CBB_add_utf8(cbb.get(), c)) {
      return false;
    }
  }

  out->assign(CBB_data(cbb.get()), CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}